

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O3

void __thiscall
test_adjacency_graph_erase_if_undirected_Test::~test_adjacency_graph_erase_if_undirected_Test
          (test_adjacency_graph_erase_if_undirected_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, erase_if_undirected) {
  Adjacency_Graph<false> saad = create_graph_saad();
  auto erase_if_odd = [](const auto& i_vertex) {
    return i_vertex % 2 != 0;
  };
  Adjacency_Graph<false> answer({{0, 3}, {0, 4}, {1, 3}, {2, 5}, {3, 4}, {5, 6}});
  answer.resize(7);

  saad.erase_if(erase_if_odd);
  FOR(i_vertex, answer.size_vertex())
  FOR(i_adjacent, answer[i_vertex].size())
  EXPECT_EQ(answer[i_vertex][i_adjacent], saad[i_vertex][i_adjacent]);
}